

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint32_t absl::lts_20250127::hash_internal::Hash32Len0to4(char *s,size_t len)

{
  uint32_t uVar1;
  ulong uStack_28;
  char v;
  size_t i;
  uint32_t c;
  uint32_t b;
  size_t len_local;
  char *s_local;
  
  i._4_4_ = 0;
  i._0_4_ = 9;
  for (uStack_28 = 0; uStack_28 < len; uStack_28 = uStack_28 + 1) {
    i._4_4_ = i._4_4_ * -0x3361d2af + (int)s[uStack_28];
    i._0_4_ = i._4_4_ ^ (uint)i;
  }
  uVar1 = Mur((uint32_t)len,(uint)i);
  uVar1 = Mur(i._4_4_,uVar1);
  uVar1 = fmix(uVar1);
  return uVar1;
}

Assistant:

static uint32_t Hash32Len0to4(const char *s, size_t len) {
  uint32_t b = 0;
  uint32_t c = 9;
  for (size_t i = 0; i < len; i++) {
    signed char v = static_cast<signed char>(s[i]);
    b = b * c1 + static_cast<uint32_t>(v);
    c ^= b;
  }
  return fmix(Mur(b, Mur(static_cast<uint32_t>(len), c)));
}